

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O2

istream * FIX::operator>>(istream *stream,Settings *s)

{
  const_iterator __position;
  bool bVar1;
  long *plVar2;
  iterator this;
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keyValue;
  char buffer [1024];
  allocator<char> local_4d9;
  Settings *local_4d8;
  string local_4d0;
  string local_4b0;
  undefined1 local_490 [32];
  string local_470;
  char local_438 [1032];
  
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  local_4d0._M_string_length = 0;
  local_4d0.field_2._M_local_buf[0] = '\0';
  this._M_current =
       (s->m_sections).super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_4d8 = s;
LAB_001b9e98:
  plVar2 = (long *)std::istream::getline((char *)stream,(long)local_438);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) {
    std::__cxx11::string::~string((string *)&local_4d0);
    return stream;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,local_438,&local_4d9);
  string_strip((string *)local_490,&local_4b0);
  std::__cxx11::string::operator=((string *)&local_4d0,(string *)local_490);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  if (local_4d0._M_string_length != 0) goto code_r0x001b9efa;
  goto LAB_001b9f13;
code_r0x001b9efa:
  if (*local_4d0._M_dataplus._M_p != '#') {
    if ((*local_4d0._M_dataplus._M_p == '[') &&
       (local_4d0._M_dataplus._M_p[local_4d0._M_string_length - 1] == ']')) {
      __position._M_current =
           (local_4d8->m_sections).
           super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
           super__Vector_impl_data._M_finish;
      splitSection(&local_4b0,&local_4d0);
      Dictionary::Dictionary((Dictionary *)local_490,&local_4b0);
      this = std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::_M_insert_rval
                       (&local_4d8->m_sections,__position,(Dictionary *)local_490);
      Dictionary::~Dictionary((Dictionary *)local_490);
      std::__cxx11::string::~string((string *)&local_4b0);
    }
    else {
LAB_001b9f13:
      bVar1 = isKeyValue(&local_4d0);
      if (bVar1) {
        splitKeyValue((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_490,&local_4d0);
        if (this._M_current !=
            (local_4d8->m_sections).
            super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (local_4d8->m_resolveEnvVars == true) {
            resolveEnvVars(&local_4b0,(string *)(local_490 + 0x20));
          }
          else {
            std::__cxx11::string::string((string *)&local_4b0,(string *)(local_490 + 0x20));
          }
          Dictionary::setString(this._M_current,(string *)local_490,&local_4b0);
          std::__cxx11::string::~string((string *)&local_4b0);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_490);
      }
    }
  }
  goto LAB_001b9e98;
}

Assistant:

std::istream &operator>>(std::istream &stream, Settings &s) {
  char buffer[1024];
  std::string line;
  Settings::Sections::iterator section = s.m_sections.end();
  ;

  while (stream.getline(buffer, sizeof(buffer))) {
    line = string_strip(buffer);
    if (isComment(line)) {
      continue;
    } else if (isSection(line)) {
      section = s.m_sections.insert(s.m_sections.end(), Dictionary(splitSection(line)));
    } else if (isKeyValue(line)) {
      std::pair<std::string, std::string> keyValue = splitKeyValue(line);
      if (section == s.m_sections.end()) {
        continue;
      }
      (*section).setString(keyValue.first, s.m_resolveEnvVars ? resolveEnvVars(keyValue.second) : keyValue.second);
    }
  }
  return stream;
}